

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_response_get_response(SASL_RESPONSE_HANDLE sasl_response,amqp_binary *response_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  uint32_t item_count;
  int result;
  amqp_binary *response_value_local;
  SASL_RESPONSE_HANDLE sasl_response_local;
  
  if (sasl_response == (SASL_RESPONSE_HANDLE)0x0) {
    sasl_response_instance._4_4_ = 0x2cb6;
  }
  else {
    _item_count = response_value;
    response_value_local = (amqp_binary *)sasl_response;
    iVar1 = amqpvalue_get_composite_item_count
                      (sasl_response->composite_value,(uint32_t *)&sasl_response_instance);
    if (iVar1 == 0) {
      if ((int)sasl_response_instance == 0) {
        sasl_response_instance._4_4_ = 0x2cc4;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(sasl_response->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          sasl_response_instance._4_4_ = 0x2ccc;
        }
        else {
          iVar1 = amqpvalue_get_binary(value,_item_count);
          if (iVar1 == 0) {
            sasl_response_instance._4_4_ = 0;
          }
          else {
            sasl_response_instance._4_4_ = 0x2cd3;
          }
        }
      }
    }
    else {
      sasl_response_instance._4_4_ = 0x2cbe;
    }
  }
  return sasl_response_instance._4_4_;
}

Assistant:

int sasl_response_get_response(SASL_RESPONSE_HANDLE sasl_response, amqp_binary* response_value)
{
    int result;

    if (sasl_response == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response;
        if (amqpvalue_get_composite_item_count(sasl_response_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_response_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_binary(item_value, response_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}